

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSAnnotation.cpp
# Opt level: O1

void __thiscall
xercesc_4_0::XSAnnotation::writeAnnotation
          (XSAnnotation *this,DOMNode *node,ANNOTATION_TARGET targetType)

{
  XMLCh *srcDocBytes;
  long lVar1;
  int iVar2;
  int iVar3;
  XercesDOMParser *this_00;
  undefined4 extraout_var;
  MemBufInputSource *this_01;
  XMLSize_t XVar5;
  DOMDocument *pDVar6;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  XMLSize_t byteCount;
  DOMNode *pDVar4;
  
  this_00 = (XercesDOMParser *)XMemory::operator_new(0xd8,(this->super_XSObject).fMemoryManager);
  XercesDOMParser::XercesDOMParser
            (this_00,(XMLValidator *)0x0,(this->super_XSObject).fMemoryManager,(XMLGrammarPool *)0x0
            );
  AbstractDOMParser::setDoNamespaces((AbstractDOMParser *)this_00,true);
  AbstractDOMParser::setValidationScheme((AbstractDOMParser *)this_00,Val_Never);
  if (targetType == W3C_DOM_ELEMENT) {
    iVar2 = (*node->_vptr_DOMNode[0xc])(node);
    pDVar4 = (DOMNode *)CONCAT44(extraout_var,iVar2);
  }
  else {
    pDVar4 = node + -3;
    if (node == (DOMNode *)0x0) {
      pDVar4 = (DOMNode *)0x0;
    }
  }
  this_01 = (MemBufInputSource *)XMemory::operator_new(0x48,(this->super_XSObject).fMemoryManager);
  srcDocBytes = this->fContents;
  if (srcDocBytes == (XMLCh *)0x0) {
    byteCount = 0;
  }
  else {
    XVar5 = 0xfffffffffffffffe;
    do {
      byteCount = XVar5 + 2;
      lVar1 = XVar5 + 2;
      XVar5 = byteCount;
    } while (*(short *)((long)srcDocBytes + lVar1) != 0);
  }
  MemBufInputSource::MemBufInputSource
            (this_01,(XMLByte *)srcDocBytes,byteCount,"",false,(this->super_XSObject).fMemoryManager
            );
  (*(this_01->super_InputSource)._vptr_InputSource[7])(this_01,&XMLUni::fgXMLChEncodingString);
  this_01->fCopyBufToStream = false;
  AbstractDOMParser::parse((AbstractDOMParser *)this_00,(InputSource *)this_01);
  pDVar6 = AbstractDOMParser::getDocument((AbstractDOMParser *)this_00);
  iVar2 = (*(pDVar6->super_DOMDocumentRange)._vptr_DOMDocumentRange[0xd])(pDVar6);
  iVar2 = (*pDVar4->_vptr_DOMNode[0xf])(pDVar4,CONCAT44(extraout_var_00,iVar2),1);
  iVar3 = (*node->_vptr_DOMNode[7])(node);
  (*node->_vptr_DOMNode[0xe])(node,CONCAT44(extraout_var_01,iVar2),CONCAT44(extraout_var_02,iVar3));
  (*(this_00->super_AbstractDOMParser).super_XMLDocumentHandler._vptr_XMLDocumentHandler[1])
            (this_00);
  (*(this_01->super_InputSource)._vptr_InputSource[1])(this_01);
  return;
}

Assistant:

void XSAnnotation::writeAnnotation(DOMNode* node, ANNOTATION_TARGET targetType)
{
    XercesDOMParser *parser = new (fMemoryManager) XercesDOMParser(0, fMemoryManager);
    parser->setDoNamespaces(true);
    parser->setValidationScheme(XercesDOMParser::Val_Never);

    DOMDocument* futureOwner = (targetType == W3C_DOM_ELEMENT) ?
        ((DOMElement*)node)->getOwnerDocument() :
        (DOMDocument*)node;

    MemBufInputSource* memBufIS = new (fMemoryManager) MemBufInputSource
    (
        (const XMLByte*)fContents
        , XMLString::stringLen(fContents)*sizeof(XMLCh)
        , ""
        , false
        , fMemoryManager
    );
    memBufIS->setEncoding(XMLUni::fgXMLChEncodingString);
    memBufIS->setCopyBufToStream(false);

    try
    {
        parser->parse(*memBufIS);
    }
    catch (const XMLException&)
    {
        // REVISIT:  should we really eat this?
    }

    DOMNode* newElem = futureOwner->importNode((parser->getDocument())->getDocumentElement(), true);
    node->insertBefore(newElem, node->getFirstChild());

    delete parser;
    delete memBufIS;
}